

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_join.cpp
# Opt level: O3

void __thiscall duckdb::LogicalJoin::ResolveTypes(LogicalJoin *this)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  vector<duckdb::LogicalType,_true> *this_01;
  byte bVar1;
  reference pvVar2;
  pointer pLVar3;
  vector<duckdb::LogicalType,_true> right_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  pointer local_38;
  pointer pLStack_30;
  pointer local_28;
  
  this_00 = &(this->super_LogicalOperator).children;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar2);
  LogicalOperator::MapTypes
            ((vector<duckdb::LogicalType,_true> *)&local_38,&pLVar3->types,
             &this->left_projection_map);
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->super_LogicalOperator).types.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->super_LogicalOperator).types.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->super_LogicalOperator).types.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLStack_30;
  local_38 = (pointer)0x0;
  pLStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38);
  bVar1 = (this->super_LogicalOperator).field_0x61;
  if (1 < bVar1 - 5) {
    this_01 = &(this->super_LogicalOperator).types;
    if (bVar1 == 7) {
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
                 &LogicalType::BOOLEAN);
    }
    else {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](this_00,1);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar2);
      LogicalOperator::MapTypes
                ((vector<duckdb::LogicalType,_true> *)&local_58,&pLVar3->types,
                 &this->right_projection_map);
      if ((byte)((this->super_LogicalOperator).field_0x61 - 9) < 2) {
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_01,
                   &local_58);
      }
      else {
        ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::LogicalType*,std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>>>
                  ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)this_01,
                   (this->super_LogicalOperator).types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   local_58.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_58.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58);
    }
  }
  return;
}

Assistant:

void LogicalJoin::ResolveTypes() {
	types = MapTypes(children[0]->types, left_projection_map);
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		// for SEMI and ANTI join we only project the left hand side
		return;
	}
	if (join_type == JoinType::MARK) {
		// for MARK join we project the left hand side, plus a BOOLEAN column indicating the MARK
		types.emplace_back(LogicalType::BOOLEAN);
		return;
	}
	// for any other join we project both sides
	auto right_types = MapTypes(children[1]->types, right_projection_map);
	if (join_type == JoinType::RIGHT_SEMI || join_type == JoinType::RIGHT_ANTI) {
		types = right_types;
		return;
	}
	types.insert(types.end(), right_types.begin(), right_types.end());
}